

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O1

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,presolve::HPresolve::strengthenInequalities(presolve::HighsPostsolveStack&,int&)::__0,false>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
               anon_class_8_1_4c1942eb comp,int bad_allowed,bool leftmost)

{
  int *piVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  pointer pdVar5;
  int *piVar6;
  ulong uVar7;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var8;
  _DistanceType __len;
  ulong uVar9;
  long lVar10;
  int *piVar11;
  int *piVar12;
  ulong uVar13;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var14;
  int *piVar15;
  long lVar16;
  int *piVar17;
  T tmp_1;
  long lVar18;
  bool bVar19;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_presolve_HPresolve_cpp:5515:47)>
  __cmp;
  
  piVar1 = end._M_current + -1;
  do {
    lVar18 = (long)end._M_current - (long)begin._M_current;
    uVar9 = lVar18 >> 2;
    if ((long)uVar9 < 0x18) {
      if ((leftmost & 1U) == 0) {
        if ((begin._M_current != end._M_current) && (begin._M_current + 1 != end._M_current)) {
          pdVar5 = ((comp.reducedcost)->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                   .super__Vector_impl_data._M_start;
          _Var8._M_current = begin._M_current;
          piVar15 = begin._M_current + 1;
          do {
            iVar3 = _Var8._M_current[1];
            dVar2 = pdVar5[iVar3];
            if ((pdVar5[*_Var8._M_current] < dVar2) ||
               ((*_Var8._M_current < iVar3 && (pdVar5[*_Var8._M_current] <= dVar2)))) {
              do {
                do {
                  piVar11 = _Var8._M_current;
                  piVar11[1] = *piVar11;
                  _Var8._M_current = piVar11 + -1;
                } while (pdVar5[piVar11[-1]] < dVar2);
              } while ((piVar11[-1] < iVar3) && (pdVar5[piVar11[-1]] <= dVar2));
              *piVar11 = iVar3;
            }
            piVar11 = piVar15 + 1;
            _Var8._M_current = piVar15;
            piVar15 = piVar11;
          } while (piVar11 != end._M_current);
        }
      }
      else if ((begin._M_current != end._M_current) &&
              (piVar15 = begin._M_current + 1, piVar15 != end._M_current)) {
        pdVar5 = ((comp.reducedcost)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar18 = 0;
        _Var8._M_current = begin._M_current;
        do {
          iVar3 = *piVar15;
          iVar4 = *_Var8._M_current;
          dVar2 = pdVar5[iVar3];
          if ((pdVar5[iVar4] < dVar2) || ((iVar4 < iVar3 && (pdVar5[iVar4] <= dVar2)))) {
            piVar11 = piVar15 + -1;
            *piVar15 = iVar4;
            if (piVar11 != begin._M_current) {
              lVar10 = 0;
              do {
                iVar4 = *(_Var8._M_current + lVar10 + -4);
                if ((dVar2 <= pdVar5[iVar4]) && ((iVar3 <= iVar4 || (dVar2 < pdVar5[iVar4]))))
                break;
                *(_Var8._M_current + lVar10) = iVar4;
                lVar10 = lVar10 + -4;
              } while (lVar18 != lVar10);
              piVar11 = lVar10 + _Var8._M_current;
            }
            *piVar11 = iVar3;
          }
          piVar15 = piVar15 + 1;
          _Var8._M_current = _Var8._M_current + 1;
          lVar18 = lVar18 + -4;
        } while (piVar15 != end._M_current);
      }
LAB_003268e4:
      bVar19 = true;
    }
    else {
      uVar7 = uVar9 >> 1;
      pdVar5 = ((comp.reducedcost)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((long)uVar9 < 0x81) {
        iVar3 = *begin._M_current;
        iVar4 = begin._M_current[uVar7];
        if ((pdVar5[iVar4] < pdVar5[iVar3]) || ((iVar4 < iVar3 && (pdVar5[iVar4] <= pdVar5[iVar3])))
           ) {
          begin._M_current[uVar7] = iVar3;
          *begin._M_current = iVar4;
        }
        iVar3 = end._M_current[-1];
        iVar4 = *begin._M_current;
        if ((pdVar5[iVar4] < pdVar5[iVar3]) || ((iVar4 < iVar3 && (pdVar5[iVar4] <= pdVar5[iVar3])))
           ) {
          *begin._M_current = iVar3;
          end._M_current[-1] = iVar4;
        }
        iVar3 = *begin._M_current;
        iVar4 = begin._M_current[uVar7];
        if ((pdVar5[iVar4] < pdVar5[iVar3]) || ((iVar4 < iVar3 && (pdVar5[iVar4] <= pdVar5[iVar3])))
           ) {
          begin._M_current[uVar7] = iVar3;
          *begin._M_current = iVar4;
        }
      }
      else {
        iVar3 = begin._M_current[uVar7];
        iVar4 = *begin._M_current;
        if ((pdVar5[iVar4] < pdVar5[iVar3]) || ((iVar4 < iVar3 && (pdVar5[iVar4] <= pdVar5[iVar3])))
           ) {
          *begin._M_current = iVar3;
          begin._M_current[uVar7] = iVar4;
        }
        iVar3 = end._M_current[-1];
        iVar4 = begin._M_current[uVar7];
        if ((pdVar5[iVar4] < pdVar5[iVar3]) || ((iVar4 < iVar3 && (pdVar5[iVar4] <= pdVar5[iVar3])))
           ) {
          begin._M_current[uVar7] = iVar3;
          end._M_current[-1] = iVar4;
        }
        iVar3 = begin._M_current[uVar7];
        iVar4 = *begin._M_current;
        if ((pdVar5[iVar4] < pdVar5[iVar3]) || ((iVar4 < iVar3 && (pdVar5[iVar4] <= pdVar5[iVar3])))
           ) {
          *begin._M_current = iVar3;
          begin._M_current[uVar7] = iVar4;
        }
        iVar3 = begin._M_current[uVar7 - 1];
        iVar4 = begin._M_current[1];
        if ((pdVar5[iVar4] < pdVar5[iVar3]) || ((iVar4 < iVar3 && (pdVar5[iVar4] <= pdVar5[iVar3])))
           ) {
          begin._M_current[1] = iVar3;
          begin._M_current[uVar7 - 1] = iVar4;
        }
        iVar3 = end._M_current[-2];
        iVar4 = begin._M_current[uVar7 - 1];
        if ((pdVar5[iVar4] < pdVar5[iVar3]) || ((iVar4 < iVar3 && (pdVar5[iVar4] <= pdVar5[iVar3])))
           ) {
          begin._M_current[uVar7 - 1] = iVar3;
          end._M_current[-2] = iVar4;
        }
        iVar3 = begin._M_current[uVar7 - 1];
        iVar4 = begin._M_current[1];
        if ((pdVar5[iVar4] < pdVar5[iVar3]) || ((iVar4 < iVar3 && (pdVar5[iVar4] <= pdVar5[iVar3])))
           ) {
          begin._M_current[1] = iVar3;
          begin._M_current[uVar7 - 1] = iVar4;
        }
        iVar3 = begin._M_current[uVar7 + 1];
        iVar4 = begin._M_current[2];
        if ((pdVar5[iVar4] < pdVar5[iVar3]) || ((iVar4 < iVar3 && (pdVar5[iVar4] <= pdVar5[iVar3])))
           ) {
          begin._M_current[2] = iVar3;
          begin._M_current[uVar7 + 1] = iVar4;
        }
        iVar3 = end._M_current[-3];
        iVar4 = begin._M_current[uVar7 + 1];
        if ((pdVar5[iVar4] < pdVar5[iVar3]) || ((iVar4 < iVar3 && (pdVar5[iVar4] <= pdVar5[iVar3])))
           ) {
          begin._M_current[uVar7 + 1] = iVar3;
          end._M_current[-3] = iVar4;
        }
        iVar3 = begin._M_current[uVar7 + 1];
        iVar4 = begin._M_current[2];
        if ((pdVar5[iVar4] < pdVar5[iVar3]) || ((iVar4 < iVar3 && (pdVar5[iVar4] <= pdVar5[iVar3])))
           ) {
          begin._M_current[2] = iVar3;
          begin._M_current[uVar7 + 1] = iVar4;
        }
        iVar3 = begin._M_current[uVar7];
        iVar4 = begin._M_current[uVar7 - 1];
        if ((pdVar5[iVar4] < pdVar5[iVar3]) || ((iVar4 < iVar3 && (pdVar5[iVar4] <= pdVar5[iVar3])))
           ) {
          begin._M_current[uVar7 - 1] = iVar3;
          begin._M_current[uVar7] = iVar4;
        }
        iVar3 = begin._M_current[uVar7 + 1];
        iVar4 = begin._M_current[uVar7];
        if ((pdVar5[iVar4] < pdVar5[iVar3]) || ((iVar4 < iVar3 && (pdVar5[iVar4] <= pdVar5[iVar3])))
           ) {
          begin._M_current[uVar7] = iVar3;
          begin._M_current[uVar7 + 1] = iVar4;
        }
        iVar3 = begin._M_current[uVar7];
        iVar4 = begin._M_current[uVar7 - 1];
        if ((pdVar5[iVar4] < pdVar5[iVar3]) || ((iVar4 < iVar3 && (pdVar5[iVar4] <= pdVar5[iVar3])))
           ) {
          begin._M_current[uVar7 - 1] = iVar3;
          begin._M_current[uVar7] = iVar4;
        }
        iVar3 = *begin._M_current;
        *begin._M_current = begin._M_current[uVar7];
        begin._M_current[uVar7] = iVar3;
      }
      if ((leftmost & 1U) == 0) {
        iVar3 = *begin._M_current;
        pdVar5 = ((comp.reducedcost)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        dVar2 = pdVar5[iVar3];
        if ((dVar2 < pdVar5[begin._M_current[-1]]) ||
           ((iVar3 < begin._M_current[-1] && (dVar2 <= pdVar5[begin._M_current[-1]]))))
        goto LAB_003263ec;
        lVar18 = 0;
        while( true ) {
          if ((dVar2 <= pdVar5[*(int *)((long)piVar1 + lVar18)]) &&
             ((iVar3 <= *(int *)((long)piVar1 + lVar18) ||
              (dVar2 < pdVar5[*(int *)((long)piVar1 + lVar18)])))) break;
          lVar18 = lVar18 + -4;
        }
        piVar15 = (int *)((long)piVar1 + lVar18);
        piVar11 = begin._M_current + 1;
        if (lVar18 == 0) {
          while (piVar12 = piVar11, piVar17 = piVar12 + -1, piVar12 + -1 < piVar15) {
            piVar17 = piVar12;
            if ((pdVar5[*piVar12] < dVar2) ||
               ((piVar11 = piVar12 + 1, *piVar12 < iVar3 && (pdVar5[*piVar12] <= dVar2)))) break;
          }
        }
        else {
          do {
            piVar17 = piVar11;
            if (pdVar5[*piVar17] < dVar2) break;
            piVar11 = piVar17 + 1;
          } while ((iVar3 <= *piVar17) || (dVar2 < pdVar5[*piVar17]));
        }
LAB_0032694e:
        if (piVar17 < piVar15) {
          iVar4 = *piVar17;
          *piVar17 = *piVar15;
          *piVar15 = iVar4;
          do {
            do {
              piVar15 = piVar15 + -1;
            } while (pdVar5[*piVar15] < dVar2);
          } while ((*piVar15 < iVar3) && (pdVar5[*piVar15] <= dVar2));
          piVar11 = piVar17 + 1;
          do {
            piVar17 = piVar11;
            if (pdVar5[*piVar17] < dVar2) break;
            piVar11 = piVar17 + 1;
          } while ((iVar3 <= *piVar17) || (dVar2 < pdVar5[*piVar17]));
          goto LAB_0032694e;
        }
        *begin._M_current = *piVar15;
        *piVar15 = iVar3;
        begin._M_current = piVar15 + 1;
        bVar19 = false;
      }
      else {
LAB_003263ec:
        iVar3 = *begin._M_current;
        pdVar5 = ((comp.reducedcost)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        dVar2 = pdVar5[iVar3];
        lVar10 = 0;
        _Var8._M_current = begin._M_current;
        while( true ) {
          piVar15 = _Var8._M_current + 1;
          if ((pdVar5[*piVar15] <= dVar2) && ((*piVar15 <= iVar3 || (pdVar5[*piVar15] < dVar2))))
          break;
          lVar10 = lVar10 + -4;
          _Var8._M_current = piVar15;
        }
        piVar11 = piVar1;
        if (lVar10 == 0) {
          while (piVar12 = piVar11, piVar17 = piVar12 + 1, piVar15 < piVar12 + 1) {
            piVar17 = piVar12;
            if ((dVar2 < pdVar5[*piVar12]) ||
               ((piVar11 = piVar12 + -1, iVar3 < *piVar12 && (dVar2 <= pdVar5[*piVar12])))) break;
          }
        }
        else {
          do {
            piVar17 = piVar11;
            if (dVar2 < pdVar5[*piVar17]) break;
            piVar11 = piVar17 + -1;
          } while ((*piVar17 <= iVar3) || (pdVar5[*piVar17] < dVar2));
        }
        piVar11 = piVar15;
        piVar12 = piVar17;
        if (piVar15 < piVar17) {
          do {
            iVar4 = *piVar11;
            *piVar11 = *piVar12;
            *piVar12 = iVar4;
            do {
              do {
                _Var8._M_current = piVar11;
                piVar11 = _Var8._M_current + 1;
              } while (dVar2 < pdVar5[*piVar11]);
            } while ((iVar3 < *piVar11) && (dVar2 <= pdVar5[*piVar11]));
            piVar6 = piVar12 + -1;
            do {
              piVar12 = piVar6;
              if (dVar2 < pdVar5[*piVar12]) break;
              piVar6 = piVar12 + -1;
            } while ((*piVar12 <= iVar3) || (pdVar5[*piVar12] < dVar2));
          } while (piVar11 < piVar12);
        }
        *begin._M_current = *_Var8._M_current;
        *_Var8._M_current = iVar3;
        uVar13 = (long)_Var8._M_current - (long)begin._M_current >> 2;
        piVar11 = _Var8._M_current + 1;
        uVar7 = (long)end._M_current - (long)piVar11 >> 2;
        if (((long)uVar13 < (long)(uVar9 >> 3)) || ((long)uVar7 < (long)(uVar9 >> 3))) {
          bad_allowed = bad_allowed + -1;
          if (bad_allowed == 0) {
            lVar10 = (long)((uVar9 - ((long)(uVar9 - 2) >> 0x3f)) + -2) >> 1;
            do {
              std::
              __adjust_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,int,__gnu_cxx::__ops::_Iter_comp_iter<presolve::HPresolve::strengthenInequalities(presolve::HighsPostsolveStack&,int&)::__0>>
                        (begin,lVar10,uVar9,begin._M_current[lVar10],
                         (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_presolve_HPresolve_cpp:5515:47)>
                          )comp.reducedcost);
              bVar19 = lVar10 != 0;
              lVar10 = lVar10 + -1;
            } while (bVar19);
            bVar19 = true;
            piVar15 = piVar1;
            while (4 < lVar18) {
              iVar3 = *piVar15;
              *piVar15 = *begin._M_current;
              lVar18 = lVar18 + -4;
              std::
              __adjust_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,int,__gnu_cxx::__ops::_Iter_comp_iter<presolve::HPresolve::strengthenInequalities(presolve::HighsPostsolveStack&,int&)::__0>>
                        (begin,0,lVar18 >> 2,iVar3,
                         (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_presolve_HPresolve_cpp:5515:47)>
                          )comp.reducedcost);
              piVar15 = piVar15 + -1;
            }
            bad_allowed = 0;
            goto LAB_003268e7;
          }
          if (0x17 < (long)uVar13) {
            uVar9 = uVar13 & 0xfffffffffffffffc;
            iVar3 = *begin._M_current;
            *begin._M_current = *(begin._M_current + uVar9);
            *(begin._M_current + uVar9) = iVar3;
            iVar3 = _Var8._M_current[-1];
            _Var8._M_current[-1] = *(_Var8._M_current - uVar9);
            *(_Var8._M_current - uVar9) = iVar3;
            if (0x80 < (long)uVar13) {
              uVar13 = uVar13 >> 2;
              iVar3 = begin._M_current[1];
              begin._M_current[1] = begin._M_current[uVar13 + 1];
              begin._M_current[uVar13 + 1] = iVar3;
              iVar3 = begin._M_current[2];
              begin._M_current[2] = begin._M_current[uVar13 + 2];
              begin._M_current[uVar13 + 2] = iVar3;
              iVar3 = _Var8._M_current[-2];
              _Var8._M_current[-2] = _Var8._M_current[~uVar13];
              _Var8._M_current[~uVar13] = iVar3;
              iVar3 = _Var8._M_current[-3];
              _Var8._M_current[-3] = _Var8._M_current[-2 - uVar13];
              _Var8._M_current[-2 - uVar13] = iVar3;
            }
          }
          if (0x17 < (long)uVar7) {
            iVar3 = _Var8._M_current[1];
            uVar9 = uVar7 & 0xfffffffffffffffc;
            _Var8._M_current[1] = *(uVar9 + 4 + _Var8._M_current);
            *(uVar9 + 4 + _Var8._M_current) = iVar3;
            iVar3 = end._M_current[-1];
            end._M_current[-1] = *(end._M_current - uVar9);
            *(end._M_current - uVar9) = iVar3;
            if (0x80 < (long)uVar7) {
              uVar7 = uVar7 >> 2;
              iVar3 = _Var8._M_current[2];
              _Var8._M_current[2] = _Var8._M_current[uVar7 + 2];
              _Var8._M_current[uVar7 + 2] = iVar3;
              iVar3 = _Var8._M_current[3];
              _Var8._M_current[3] = _Var8._M_current[uVar7 + 3];
              _Var8._M_current[uVar7 + 3] = iVar3;
              iVar3 = end._M_current[-2];
              end._M_current[-2] = end._M_current[~uVar7];
              end._M_current[~uVar7] = iVar3;
              iVar3 = end._M_current[-3];
              end._M_current[-3] = end._M_current[-2 - uVar7];
              end._M_current[-2 - uVar7] = iVar3;
            }
          }
        }
        else if (piVar17 <= piVar15) {
          if (begin._M_current == _Var8._M_current) {
LAB_0032681b:
            if (piVar11 == end._M_current) goto LAB_003268e4;
            lVar18 = 4;
            lVar10 = 0;
            uVar9 = 0;
            do {
              piVar15 = _Var8._M_current + lVar18 + 4;
              if (piVar15 == end._M_current) goto LAB_003268e4;
              piVar17 = _Var8._M_current + lVar18;
              iVar3 = *piVar15;
              iVar4 = *piVar17;
              dVar2 = pdVar5[iVar3];
              if ((pdVar5[iVar4] < dVar2) || ((iVar4 < iVar3 && (pdVar5[iVar4] <= dVar2)))) {
                *piVar15 = iVar4;
                lVar16 = lVar10;
                if (lVar18 != 4) {
                  do {
                    iVar4 = *(_Var8._M_current + lVar16);
                    if ((dVar2 <= pdVar5[iVar4]) && ((iVar3 <= iVar4 || (dVar2 < pdVar5[iVar4]))))
                    break;
                    *(int *)((long)piVar11 + lVar16) = iVar4;
                    lVar16 = lVar16 + -4;
                  } while (lVar16 != 0);
                  piVar17 = (int *)(lVar16 + (long)piVar11);
                }
                *piVar17 = iVar3;
                uVar9 = uVar9 + ((long)piVar15 - (long)piVar17 >> 2);
              }
              lVar18 = lVar18 + 4;
              lVar10 = lVar10 + 4;
            } while (uVar9 < 9);
          }
          else {
            lVar18 = 0;
            uVar9 = 0;
            _Var14._M_current = begin._M_current;
            do {
              piVar15 = _Var14._M_current + 1;
              if (piVar15 == _Var8._M_current) goto LAB_0032681b;
              iVar3 = _Var14._M_current[1];
              iVar4 = *_Var14._M_current;
              dVar2 = pdVar5[iVar3];
              if ((pdVar5[iVar4] < dVar2) || ((iVar4 < iVar3 && (pdVar5[iVar4] <= dVar2)))) {
                _Var14._M_current[1] = iVar4;
                if (_Var14._M_current != begin._M_current) {
                  lVar10 = 0;
                  do {
                    iVar4 = *(_Var14._M_current + lVar10 + -4);
                    if ((dVar2 <= pdVar5[iVar4]) && ((iVar3 <= iVar4 || (dVar2 < pdVar5[iVar4]))))
                    break;
                    *(_Var14._M_current + lVar10) = iVar4;
                    lVar10 = lVar10 + -4;
                  } while (lVar18 != lVar10);
                  _Var14._M_current = _Var14._M_current + lVar10;
                }
                *_Var14._M_current = iVar3;
                uVar9 = uVar9 + ((long)piVar15 - (long)_Var14._M_current >> 2);
              }
              lVar18 = lVar18 + -4;
              _Var14._M_current = piVar15;
            } while (uVar9 < 9);
          }
        }
        pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,presolve::HPresolve::strengthenInequalities(presolve::HighsPostsolveStack&,int&)::__0,false>
                  (begin,_Var8,comp,bad_allowed,(bool)(leftmost & 1));
        bVar19 = false;
        leftmost = false;
        begin._M_current = piVar11;
      }
    }
LAB_003268e7:
    if (bVar19) {
      return;
    }
  } while( true );
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }